

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O0

void __thiscall Dinic_Capacities_Test::TestBody(Dinic_Capacities_Test *this)

{
  int a;
  int b;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_09;
  bool bVar1;
  reference pvVar2;
  char *message;
  vector<int,_std::allocator<int>_> *local_3f0;
  AssertHelper local_340;
  Message local_338;
  int local_32c;
  Flow local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> *e;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1;
  undefined4 local_2e8;
  undefined4 local_2e4;
  iterator local_2e0;
  size_type local_2d8;
  allocator<int> local_2cd;
  int local_2cc [3];
  iterator local_2c0;
  size_type local_2b8;
  allocator<int> local_2ad;
  int local_2ac [3];
  iterator local_2a0;
  size_type local_298;
  allocator<int> local_28d;
  int local_28c [3];
  iterator local_280;
  size_type local_278;
  allocator<int> local_26d;
  int local_26c [3];
  iterator local_260;
  size_type local_258;
  allocator<int> local_24d;
  int local_24c [3];
  iterator local_240;
  size_type local_238;
  allocator<int> local_22d;
  int local_22c [3];
  iterator local_220;
  size_type local_218;
  allocator<int> local_20d;
  int local_20c [3];
  iterator local_200;
  size_type local_1f8;
  allocator<int> local_1ed;
  int local_1ec [3];
  iterator local_1e0;
  size_type local_1d8;
  allocator<int> local_1bd;
  int local_1bc [3];
  iterator local_1b0;
  size_type local_1a8;
  vector<int,_std::allocator<int>_> *local_1a0;
  vector<int,_std::allocator<int>_> local_198;
  vector<int,_std::allocator<int>_> local_180;
  vector<int,_std::allocator<int>_> local_168;
  vector<int,_std::allocator<int>_> local_150;
  vector<int,_std::allocator<int>_> local_138;
  vector<int,_std::allocator<int>_> local_120;
  vector<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  vector<int,_std::allocator<int>_> local_d8;
  vector<int,_std::allocator<int>_> local_c0;
  undefined1 local_a8 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  edges;
  Dinic d;
  Dinic_Capacities_Test *this_local;
  
  Dinic::Dinic((Dinic *)&edges.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,8);
  __range1._2_1_ = 1;
  local_1bc[0] = 0;
  local_1bc[1] = 1;
  local_1bc[2] = 1;
  local_1b0 = local_1bc;
  local_1a8 = 3;
  local_1a0 = &local_198;
  std::allocator<int>::allocator(&local_1bd);
  __l_08._M_len = local_1a8;
  __l_08._M_array = local_1b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_198,__l_08,&local_1bd);
  local_1ec[0] = 1;
  local_1ec[1] = 2;
  local_1ec[2] = 1;
  local_1e0 = local_1ec;
  local_1d8 = 3;
  local_1a0 = &local_180;
  std::allocator<int>::allocator(&local_1ed);
  __l_07._M_len = local_1d8;
  __l_07._M_array = local_1e0;
  std::vector<int,_std::allocator<int>_>::vector(&local_180,__l_07,&local_1ed);
  local_20c[0] = 2;
  local_20c[1] = 3;
  local_20c[2] = 1;
  local_200 = local_20c;
  local_1f8 = 3;
  local_1a0 = &local_168;
  std::allocator<int>::allocator(&local_20d);
  __l_06._M_len = local_1f8;
  __l_06._M_array = local_200;
  std::vector<int,_std::allocator<int>_>::vector(&local_168,__l_06,&local_20d);
  local_22c[0] = 0;
  local_22c[1] = 4;
  local_22c[2] = 2;
  local_220 = local_22c;
  local_218 = 3;
  local_1a0 = &local_150;
  std::allocator<int>::allocator(&local_22d);
  __l_05._M_len = local_218;
  __l_05._M_array = local_220;
  std::vector<int,_std::allocator<int>_>::vector(&local_150,__l_05,&local_22d);
  local_24c[0] = 4;
  local_24c[1] = 5;
  local_24c[2] = 2;
  local_240 = local_24c;
  local_238 = 3;
  local_1a0 = &local_138;
  std::allocator<int>::allocator(&local_24d);
  __l_04._M_len = local_238;
  __l_04._M_array = local_240;
  std::vector<int,_std::allocator<int>_>::vector(&local_138,__l_04,&local_24d);
  local_26c[0] = 5;
  local_26c[1] = 2;
  local_26c[2] = 2;
  local_260 = local_26c;
  local_258 = 3;
  local_1a0 = &local_120;
  std::allocator<int>::allocator(&local_26d);
  __l_03._M_len = local_258;
  __l_03._M_array = local_260;
  std::vector<int,_std::allocator<int>_>::vector(&local_120,__l_03,&local_26d);
  local_28c[0] = 2;
  local_28c[1] = 1;
  local_28c[2] = 1;
  local_280 = local_28c;
  local_278 = 3;
  local_1a0 = &local_108;
  std::allocator<int>::allocator(&local_28d);
  __l_02._M_len = local_278;
  __l_02._M_array = local_280;
  std::vector<int,_std::allocator<int>_>::vector(&local_108,__l_02,&local_28d);
  local_2ac[0] = 1;
  local_2ac[1] = 6;
  local_2ac[2] = 2;
  local_2a0 = local_2ac;
  local_298 = 3;
  local_1a0 = &local_f0;
  std::allocator<int>::allocator(&local_2ad);
  __l_01._M_len = local_298;
  __l_01._M_array = local_2a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_01,&local_2ad);
  local_2cc[0] = 6;
  local_2cc[1] = 7;
  local_2cc[2] = 2;
  local_2c0 = local_2cc;
  local_2b8 = 3;
  local_1a0 = &local_d8;
  std::allocator<int>::allocator(&local_2cd);
  __l_00._M_len = local_2b8;
  __l_00._M_array = local_2c0;
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l_00,&local_2cd);
  __range1._4_4_ = 7;
  local_2e8 = 3;
  local_2e4 = 2;
  local_2e0 = (iterator)((long)&__range1 + 4);
  local_2d8 = 3;
  local_1a0 = &local_c0;
  std::allocator<int>::allocator((allocator<int> *)((long)&__range1 + 3));
  __l._M_len = local_2d8;
  __l._M_array = local_2e0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_c0,__l,(allocator<int> *)((long)&__range1 + 3));
  __range1._2_1_ = 0;
  local_a8._0_8_ = &local_198;
  local_a8._8_8_ = (pointer)0xa;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&__range1 + 1));
  __l_09._M_len = local_a8._8_8_;
  __l_09._M_array = (iterator)local_a8._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_a8 + 0x10),__l_09,
           (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&__range1 + 1));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&__range1 + 1));
  local_3f0 = (vector<int,_std::allocator<int>_> *)local_a8;
  do {
    local_3f0 = local_3f0 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_3f0);
  } while (local_3f0 != &local_198);
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range1 + 3));
  std::allocator<int>::~allocator(&local_2cd);
  std::allocator<int>::~allocator(&local_2ad);
  std::allocator<int>::~allocator(&local_28d);
  std::allocator<int>::~allocator(&local_26d);
  std::allocator<int>::~allocator(&local_24d);
  std::allocator<int>::~allocator(&local_22d);
  std::allocator<int>::~allocator(&local_20d);
  std::allocator<int>::~allocator(&local_1ed);
  std::allocator<int>::~allocator(&local_1bd);
  __end1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(local_a8 + 0x10));
  e = (vector<int,_std::allocator<int>_> *)
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_a8 + 0x10));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                     *)&e), bVar1) {
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __gnu_cxx::
         __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
         ::operator*(&__end1);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)gtest_ar.message_.ptr_,0);
    a = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)gtest_ar.message_.ptr_,1);
    b = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)gtest_ar.message_.ptr_,2);
    Dinic::addEdge((Dinic *)&edges.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,a,b,(long)*pvVar2);
    __gnu_cxx::
    __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1);
  }
  local_328 = Dinic::getFlow((Dinic *)&edges.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0,3);
  local_32c = 3;
  testing::internal::EqHelper<false>::Compare<long_long,int>
            ((EqHelper<false> *)local_320,"d.getFlow(0, 3)","3",&local_328,&local_32c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/dinic_test.cpp"
               ,0x3a,message);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_a8 + 0x10));
  Dinic::~Dinic((Dinic *)&edges.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Dinic, Capacities) {
    // We construct a graph where it is necessary to consider residual capacities
    Dinic d(8);
    vector<vector<int>> edges = {
        {0, 1, 1},
        {1, 2, 1},
        {2, 3, 1},
        {0, 4, 2},
        {4, 5, 2},
        {5, 2, 2},
        {2, 1, 1}, // the important reverse edge
        {1, 6, 2},
        {6, 7, 2},
        {7, 3, 2},
    };
    for (auto &e : edges) {
        d.addEdge(e[0], e[1], e[2]);
    }
    
    EXPECT_EQ(d.getFlow(0, 3), 3);
}